

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

void Wlc_Init(Abc_Frame_t *pAbc)

{
  Cmd_CommandAdd(pAbc,"Word level","%read",Abc_CommandReadWlc,0);
  Cmd_CommandAdd(pAbc,"Word level","%write",Abc_CommandWriteWlc,0);
  Cmd_CommandAdd(pAbc,"Word level","%ps",Abc_CommandPs,0);
  Cmd_CommandAdd(pAbc,"Word level","%cone",Abc_CommandCone,0);
  Cmd_CommandAdd(pAbc,"Word level","%abs",Abc_CommandAbs,0);
  Cmd_CommandAdd(pAbc,"Word level","%pdra",Abc_CommandPdrAbs,0);
  Cmd_CommandAdd(pAbc,"Word level","%abs2",Abc_CommandAbs2,0);
  Cmd_CommandAdd(pAbc,"Word level","%memabs",Abc_CommandMemAbs,0);
  Cmd_CommandAdd(pAbc,"Word level","%memabs2",Abc_CommandMemAbs2,0);
  Cmd_CommandAdd(pAbc,"Word level","%blast",Abc_CommandBlast,0);
  Cmd_CommandAdd(pAbc,"Word level","%blastmem",Abc_CommandBlastMem,0);
  Cmd_CommandAdd(pAbc,"Word level","%graft",Abc_CommandGraft,0);
  Cmd_CommandAdd(pAbc,"Word level","%retime",Abc_CommandRetime,0);
  Cmd_CommandAdd(pAbc,"Word level","%profile",Abc_CommandProfile,0);
  Cmd_CommandAdd(pAbc,"Word level","%short_names",Abc_CommandShortNames,0);
  Cmd_CommandAdd(pAbc,"Word level","%show",Abc_CommandShow,0);
  Cmd_CommandAdd(pAbc,"Word level","%test",Abc_CommandTest,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_ps",Abc_CommandInvPs,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_print",Abc_CommandInvPrint,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_check",Abc_CommandInvCheck,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_get",Abc_CommandInvGet,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_put",Abc_CommandInvPut,0);
  Cmd_CommandAdd(pAbc,"Word level","inv_min",Abc_CommandInvMin,0);
  return;
}

Assistant:

void Wlc_Init( Abc_Frame_t * pAbc )
{
    Cmd_CommandAdd( pAbc, "Word level", "%read",        Abc_CommandReadWlc,    0 );
    Cmd_CommandAdd( pAbc, "Word level", "%write",       Abc_CommandWriteWlc,   0 );
    Cmd_CommandAdd( pAbc, "Word level", "%ps",          Abc_CommandPs,         0 );
    Cmd_CommandAdd( pAbc, "Word level", "%cone",        Abc_CommandCone,       0 );
    Cmd_CommandAdd( pAbc, "Word level", "%abs",         Abc_CommandAbs,        0 );
    Cmd_CommandAdd( pAbc, "Word level", "%pdra",        Abc_CommandPdrAbs,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "%abs2",        Abc_CommandAbs2,       0 );
    Cmd_CommandAdd( pAbc, "Word level", "%memabs",      Abc_CommandMemAbs,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "%memabs2",     Abc_CommandMemAbs2,    0 );
    Cmd_CommandAdd( pAbc, "Word level", "%blast",       Abc_CommandBlast,      0 );
    Cmd_CommandAdd( pAbc, "Word level", "%blastmem",    Abc_CommandBlastMem,   0 );
    Cmd_CommandAdd( pAbc, "Word level", "%graft",       Abc_CommandGraft,      0 );
    Cmd_CommandAdd( pAbc, "Word level", "%retime",      Abc_CommandRetime,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "%profile",     Abc_CommandProfile,    0 );
    Cmd_CommandAdd( pAbc, "Word level", "%short_names", Abc_CommandShortNames, 0 );
    Cmd_CommandAdd( pAbc, "Word level", "%show",        Abc_CommandShow,       0 );
    Cmd_CommandAdd( pAbc, "Word level", "%test",        Abc_CommandTest,       0 );

    Cmd_CommandAdd( pAbc, "Word level", "inv_ps",       Abc_CommandInvPs,      0 );
    Cmd_CommandAdd( pAbc, "Word level", "inv_print",    Abc_CommandInvPrint,   0 );
    Cmd_CommandAdd( pAbc, "Word level", "inv_check",    Abc_CommandInvCheck,   0 );
    Cmd_CommandAdd( pAbc, "Word level", "inv_get",      Abc_CommandInvGet,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "inv_put",      Abc_CommandInvPut,     0 );
    Cmd_CommandAdd( pAbc, "Word level", "inv_min",      Abc_CommandInvMin,     0 );
}